

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  ~Solver(this);
  operator_delete(this,0x360);
  return;
}

Assistant:

Solver::~Solver()
{
}